

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::lambda(Parser *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Expression> pVar2;
  allocator<char> local_89;
  ptr<ObjectExpression> objectDescriptor;
  Identifier local_70;
  ptr<Function> function;
  __shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2> local_40;
  IdentifierList parameters;
  
  consume(in_RSI);
  consume(in_RSI,LeftParen,"\'(\'");
  identifierList_abi_cxx11_(&parameters,in_RSI);
  consume(in_RSI,RightParen,"\')\'");
  std::
  make_shared<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_70);
  statementBlock((Parser *)&objectDescriptor);
  std::
  make_shared<Function,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::shared_ptr<StatementBlock>&>
            ((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&function,(shared_ptr<StatementBlock> *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
  std::make_shared<ObjectExpression>();
  this_00 = objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"call",&local_89);
  std::__shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>);
  ObjectExpression::putFunction(this_00,&local_70,Public,(ptr<Function> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::~string((string *)&local_70);
  _Var1 = objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filepath)._M_dataplus._M_p =
       (pointer)objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  (this->filepath)._M_string_length = (size_type)_Var1._M_pi;
  objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parameters);
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::lambda() {
    consume();
    consume(TokenType::LeftParen, "'('");
    IdentifierList parameters = identifierList();
    consume(TokenType::RightParen, "')'");

    ptr<Function> function = make<Function>(make<IdentifierList>(parameters), statementBlock());

    ptr<ObjectExpression> objectDescriptor = make<ObjectExpression>();
    objectDescriptor -> putFunction("call", Scope::Public, function);
    return objectDescriptor;
}